

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O0

SubdirectoryDisposer *
ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
useApprovalsSubdirectory(string *subdirectory)

{
  string *in_RSI;
  SubdirectoryDisposer *in_RDI;
  string local_30 [8];
  string *in_stack_ffffffffffffffd8;
  SubdirectoryDisposer *in_stack_ffffffffffffffe0;
  
  ::std::__cxx11::string::string(local_30,in_RSI);
  SubdirectoryDisposer::SubdirectoryDisposer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ::std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

static SubdirectoryDisposer
        useApprovalsSubdirectory(const std::string& subdirectory = "approval_tests")
        {
            return SubdirectoryDisposer(subdirectory);
        }